

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::getStopPosition
          (ArchiveProxy *this,int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  StopPositionRequest *pSVar2;
  uint64_t uVar3;
  undefined1 local_60 [8];
  StopPositionRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t recordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::StopPositionRequest::StopPositionRequest
            ((StopPositionRequest *)local_60);
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopPositionRequest>
                     (this,(StopPositionRequest *)local_60);
  pSVar2 = io::aeron::archive::codecs::StopPositionRequest::controlSessionId
                     (pSVar2,msg.m_actingVersion);
  pSVar2 = io::aeron::archive::codecs::StopPositionRequest::correlationId(pSVar2,correlationId);
  io::aeron::archive::codecs::StopPositionRequest::recordingId(pSVar2,recordingId);
  uVar3 = io::aeron::archive::codecs::StopPositionRequest::encodedLength
                    ((StopPositionRequest *)local_60);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::getStopPosition(std::int64_t recordingId, std::int64_t correlationId, std::int64_t controlSessionId)
{
    codecs::StopPositionRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId);

    return offer(msg.encodedLength());
}